

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_State_PDU.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::PDU::Minefield_State_PDU::operator==(Minefield_State_PDU *this,Minefield_State_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Minefield_Header::operator!=(&this->super_Minefield_Header,&Value->super_Minefield_Header)
  ;
  if ((((((!KVar1) && ((this->m_SeqNumUnion).m_ui16SeqNum == (Value->m_SeqNumUnion).m_ui16SeqNum))
        && (this->m_ui8ForceID == Value->m_ui8ForceID)) &&
       ((this->m_ui8NumPerimPoints == Value->m_ui8NumPerimPoints &&
        (KVar1 = DATA_TYPE::EntityType::operator!=(&this->m_MinefieldType,&Value->m_MinefieldType),
        !KVar1)))) &&
      ((this->m_ui16NumMineTypes == Value->m_ui16NumMineTypes &&
       ((KVar1 = DATA_TYPE::WorldCoordinates::operator!=(&this->m_Loc,&Value->m_Loc), !KVar1 &&
        (KVar1 = DATA_TYPE::EulerAngles::operator!=(&this->m_Ori,&Value->m_Ori), !KVar1)))))) &&
     ((KVar1 = DATA_TYPE::MinefieldAppearance::operator!=(&this->m_App,&Value->m_App), !KVar1 &&
      (((this->m_ui16ProtocolModeUnion).m_ui16ProtocolMode16 ==
        (Value->m_ui16ProtocolModeUnion).m_ui16ProtocolMode16 &&
       (bVar2 = std::operator!=(&this->m_vPoints,&Value->m_vPoints), !bVar2)))))) {
    bVar2 = std::operator!=(&this->m_vMineTypes,&Value->m_vMineTypes);
    return !bVar2;
  }
  return false;
}

Assistant:

KBOOL Minefield_State_PDU::operator == ( const Minefield_State_PDU & Value ) const
{
    if( Minefield_Header::operator != ( Value ) )                        return false;
    if( m_SeqNumUnion.m_ui16SeqNum != Value.m_SeqNumUnion.m_ui16SeqNum ) return false;
    if( m_ui8ForceID               != Value.m_ui8ForceID )               return false;
    if( m_ui8NumPerimPoints        != Value.m_ui8NumPerimPoints )        return false;
    if( m_MinefieldType            != Value.m_MinefieldType )            return false;
    if( m_ui16NumMineTypes         != Value.m_ui16NumMineTypes )         return false;
    if( m_Loc                      != Value.m_Loc )                      return false;
    if( m_Ori                      != Value.m_Ori )                      return false;
    if( m_App                      != Value.m_App )                      return false;
    if( m_ui16ProtocolModeUnion.m_ui16ProtocolMode16 != Value.m_ui16ProtocolModeUnion.m_ui16ProtocolMode16 ) return false;
    if( m_vPoints                  != Value.m_vPoints )                  return false;
    if( m_vMineTypes               != Value.m_vMineTypes )               return false;
    return true;
}